

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

void __thiscall slang::SVInt::initSlowCase(SVInt *this,SVIntStorage *other)

{
  void *pvVar1;
  unsigned_long *in_RDI;
  uint32_t words;
  unsigned_long *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd8 [16];
  
  getNumWords((SVInt *)0x21099d);
  pvVar1 = operator_new__(0x2109c6);
  *in_RDI = (unsigned_long)pvVar1;
  std::ranges::__copy_fn::operator()<unsigned_long_*,_unsigned_long_*,_unsigned_long_*>
            (in_stack_ffffffffffffffd8._8_8_,in_stack_ffffffffffffffd8._0_8_,in_RDI,
             in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void SVInt::initSlowCase(const SVIntStorage& other) {
    uint32_t words = getNumWords();
    pVal = new uint64_t[words];
    std::ranges::copy(other.pVal, other.pVal + words, pVal);
}